

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O2

bool pvmath::houghTransform<float>(void)

{
  float maximum;
  undefined1 auVar1 [16];
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong __n;
  uint uVar7;
  pointer pPVar8;
  undefined1 auVar9 [16];
  float __x;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_ZMM4 [64];
  undefined1 in_register_00001344 [12];
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> pointOffLine;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> pointOnLine;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> point;
  float local_48;
  
  uVar7 = 0;
  do {
    uVar3 = Test_Helper::runCount();
    if (uVar3 <= uVar7) {
LAB_0017c94d:
      return uVar3 <= uVar7;
    }
    iVar4 = rand();
    dVar14 = toRadians((double)(iVar4 % 0x168 + -0xb4));
    __x = (float)dVar14;
    iVar4 = rand();
    auVar15._0_4_ = (float)(iVar4 % 100);
    auVar15._4_12_ = in_ZMM4._4_12_;
    auVar15 = vfmadd213ss_fma(auVar15,SUB6416(ZEXT464(0x3dcccccd),0),ZEXT416(0));
    dVar14 = toRadians((double)(auVar15._0_4_ + 0.1));
    uVar5 = rand();
    iVar4 = rand();
    auVar9._0_4_ = (float)(iVar4 % 0x1ea);
    auVar9._4_12_ = in_ZMM4._4_12_;
    auVar15 = vfmadd132ss_fma(auVar9,SUB6416(ZEXT464(0x3dcccccd),0),ZEXT416(0x3c23d70a));
    maximum = auVar15._0_4_ * 0.5;
    uVar6 = rand();
    __n = (ulong)uVar6 % 100;
    if ((uint)__n < 0x33) {
      __n = 0x32;
    }
    std::vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::vector
              ((vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)
               &point.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>,
               __n,(allocator_type *)&pointOnLine);
    fVar10 = sinf(__x);
    fVar11 = cosf(__x);
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    auVar9 = vxorps_avx512vl(ZEXT416((uint)maximum),auVar1);
    for (pPVar8 = point.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar8 != point.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pPVar8 = pPVar8 + 1) {
      iVar4 = rand();
      auVar16._0_4_ = (float)(iVar4 % 200000);
      auVar16._4_12_ = in_register_00001344;
      auVar1 = vfmadd132ss_fma(auVar16,SUB6416(ZEXT464(0xc47a0000),0),ZEXT416(0x3c23d70a));
      local_48 = auVar9._0_4_;
      fVar12 = Unit_Test::randomFloatValue<float>(local_48,maximum,maximum / 10.0);
      fVar12 = fVar12 + auVar1._0_4_;
      fVar13 = Unit_Test::randomFloatValue<float>(local_48,maximum,maximum / 10.0);
      in_ZMM4 = ZEXT464((uint)fVar12);
      auVar16 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar13)),ZEXT416((uint)fVar12),
                                ZEXT416((uint)fVar11));
      auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar13)),ZEXT416((uint)fVar10),
                               ZEXT416((uint)fVar12));
      pPVar8->x = auVar16._0_4_;
      pPVar8->y = auVar1._0_4_;
    }
    pointOnLine.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pointOffLine.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pointOnLine.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    pointOnLine.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    pointOffLine.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pointOffLine.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar2 = Image_Function::HoughTransform
                      ((vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)
                       &point.
                        super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                       ,__x,(float)dVar14,
                       (float)dVar14 / (float)(uVar5 % 0x32 + (uint)(uVar5 % 0x32 == 0)),
                       auVar15._0_4_,&pointOnLine,
                       (vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)
                       &pointOffLine.
                        super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                      );
    if ((!bVar2) ||
       (pointOffLine.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        pointOffLine.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      std::_Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::~_Vector_base
                (&pointOffLine.
                  super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>);
      std::_Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::~_Vector_base
                (&pointOnLine.
                  super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>);
      std::_Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::~_Vector_base
                (&point.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>
                );
      goto LAB_0017c94d;
    }
    std::_Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::~_Vector_base
              (&pointOffLine.
                super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>);
    std::_Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::~_Vector_base
              ((_Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *)
               &pointOnLine);
    std::_Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>::~_Vector_base
              (&point.super__Vector_base<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_>);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

bool houghTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const _Type angle = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>(-180, 180, 1 ) ) );
            const _Type angleTolerance = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>( 0, 10, 0.1f ) + 0.1f ) );
            const _Type angleStep = angleTolerance / Unit_Test::randomValue( 1, 50 );
            const _Type lineTolerance = Unit_Test::randomFloatValue<_Type>( 0.1f, 5, 0.01f );

            const _Type noiseValue = lineTolerance / 2;
            std::vector< PointBase2D<_Type> > point( Unit_Test::randomValue<uint32_t>( 50u, 100u ) );

            const _Type sinVal = std::sin( angle );
            const _Type cosVal = std::cos( angle );

            for ( typename std::vector< PointBase2D<_Type> >::iterator p = point.begin(); p != point.end(); ++p ) {
                const _Type x = Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) + Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );
                const _Type y = Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );

                p->x = x * cosVal - y * sinVal;
                p->y = x * sinVal + y * cosVal;
            }

            std::vector< PointBase2D<_Type> > pointOnLine;
            std::vector< PointBase2D<_Type> > pointOffLine;

            if ( !Image_Function::HoughTransform( point, angle, angleTolerance, angleStep, lineTolerance, pointOnLine, pointOffLine ) ||
                 !pointOffLine.empty() )
                return false;
        }

        return true;
    }